

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O3

SinkCombineResultType __thiscall
duckdb::PhysicalBatchInsert::Combine
          (PhysicalBatchInsert *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  optional_idx *this_00;
  BatchInsertGlobalState *this_01;
  LocalSinkState *pLVar1;
  TransactionData transaction;
  int iVar2;
  QueryProfiler *this_02;
  idx_t iVar3;
  undefined4 extraout_var;
  RowGroupCollection *this_03;
  undefined4 extraout_var_00;
  OptimisticDataWriter *this_04;
  type other;
  unique_lock<std::mutex> guard;
  undefined1 local_48 [8];
  bool bStack_40;
  undefined7 uStack_3f;
  transaction_t local_38;
  
  this_01 = (BatchInsertGlobalState *)input->global_state;
  pLVar1 = input->local_state;
  this_02 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,&this->super_PhysicalOperator);
  QueryProfiler::Flush(this_02,&context->thread->profiler);
  this_00 = &(pLVar1->partition_info).min_batch_index;
  iVar3 = optional_idx::GetIndex(this_00);
  BatchMemoryManager::UpdateMinBatchIndex(&this_01->memory_manager,iVar3);
  if (pLVar1[6].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0xffffffffffffffff) {
    TransactionData::TransactionData((TransactionData *)local_48,0,0);
    iVar2 = (*(this_01->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])();
    this_03 = DataTable::GetOptimisticCollection
                        ((DataTable *)CONCAT44(extraout_var,iVar2),context->client,
                         (PhysicalIndex)
                         pLVar1[6].partition_info.partition_data.
                         super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                         .
                         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    transaction.transaction_id._1_7_ = uStack_3f;
    transaction.transaction_id._0_1_ = bStack_40;
    transaction.transaction.ptr = (DuckTransaction *)local_48;
    transaction.start_time = local_38;
    RowGroupCollection::FinalizeAppend
              (this_03,transaction,(TableAppendState *)&pLVar1[1].partition_info);
    iVar3 = RowGroupCollection::GetTotalRows(this_03);
    if (iVar3 != 0) {
      iVar3 = optional_idx::GetIndex(this_00);
      BatchInsertGlobalState::AddCollection
                (this_01,context->client,(idx_t)pLVar1[1]._vptr_LocalSinkState,iVar3,
                 (PhysicalIndex)
                 pLVar1[6].partition_info.partition_data.
                 super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                 .
                 super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (optional_ptr<duckdb::OptimisticDataWriter,_true>)0x0);
      pLVar1[6].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
    }
  }
  if (pLVar1[6].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this_01->lock);
    if (iVar2 != 0) {
      ::std::__throw_system_error(iVar2);
    }
    iVar2 = (*(this_01->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])();
    this_04 = DataTable::GetOptimisticWriter
                        ((DataTable *)CONCAT44(extraout_var_00,iVar2),context->client);
    other = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
            ::operator*((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                         *)&pLVar1[6].partition_info.partition_data.
                            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                            .
                            super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    OptimisticDataWriter::Merge(this_04,other);
    pthread_mutex_unlock((pthread_mutex_t *)&this_01->lock);
  }
  local_48 = (undefined1  [8])&(this_01->memory_manager).super_StateWithBlockableTasks.lock;
  bStack_40 = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  bStack_40 = true;
  StateWithBlockableTasks::UnblockTasks
            (&(this_01->memory_manager).super_StateWithBlockableTasks,
             (unique_lock<std::mutex> *)local_48);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalBatchInsert::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<BatchInsertGlobalState>();
	auto &lstate = input.local_state.Cast<BatchInsertLocalState>();
	auto &memory_manager = gstate.memory_manager;
	auto &client_profiler = QueryProfiler::Get(context.client);
	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);

	memory_manager.UpdateMinBatchIndex(lstate.partition_info.min_batch_index.GetIndex());

	if (lstate.collection_index.IsValid()) {
		TransactionData tdata(0, 0);
		auto &collection = gstate.table.GetStorage().GetOptimisticCollection(context.client, lstate.collection_index);
		collection.FinalizeAppend(tdata, lstate.current_append_state);
		if (collection.GetTotalRows() > 0) {
			auto batch_index = lstate.partition_info.min_batch_index.GetIndex();
			gstate.AddCollection(context.client, lstate.current_index, batch_index, lstate.collection_index);
			lstate.collection_index = PhysicalIndex(DConstants::INVALID_INDEX);
		}
	}
	if (lstate.optimistic_writer) {
		lock_guard<mutex> l(gstate.lock);
		auto &optimistic_writer = gstate.table.GetStorage().GetOptimisticWriter(context.client);
		optimistic_writer.Merge(*lstate.optimistic_writer);
	}

	// unblock any blocked tasks
	auto guard = memory_manager.Lock();
	memory_manager.UnblockTasks(guard);

	return SinkCombineResultType::FINISHED;
}